

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFactoryRegistry.cpp
# Opt level: O1

void __thiscall tcu::FactoryBase::FactoryBase(FactoryBase *this,string *name,string *description)

{
  pointer pcVar1;
  
  (this->super_AbstractFactory)._vptr_AbstractFactory = (_func_int **)&PTR__FactoryBase_00d4b698;
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_name,pcVar1,pcVar1 + name->_M_string_length);
  (this->m_description)._M_dataplus._M_p = (pointer)&(this->m_description).field_2;
  pcVar1 = (description->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_description,pcVar1,pcVar1 + description->_M_string_length);
  return;
}

Assistant:

FactoryBase::FactoryBase (const std::string& name, const std::string& description)
	: m_name		(name)
	, m_description	(description)
{
}